

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_cluster_on_close(intptr_t uuid,fio_protocol_s *pr_)

{
  code *pcVar1;
  int iVar2;
  fio_ls_s *pfVar3;
  fio_ls_s *pfVar4;
  fio_lock_i fVar5;
  uint uVar6;
  __pid_t __pid;
  long lVar7;
  long lVar8;
  fio_ls_s *__ptr;
  fio_sub_hash__ordered_s_ *pos;
  _func_void_intptr_t_fio_protocol_s_ptr *p_Var9;
  _func_void_intptr_t_fio_protocol_s_ptr *p_Var10;
  fio_lock_i ret;
  timespec local_88;
  undefined8 uStack_78;
  undefined3 uStack_70;
  undefined5 uStack_6d;
  undefined3 uStack_68;
  undefined5 uStack_65;
  undefined3 uStack_60;
  undefined5 uStack_5d;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined1 local_40;
  
  if (fio_data->is_worker == '\0') {
    LOCK();
    UNLOCK();
    local_88.tv_sec = CONCAT71(local_88.tv_sec._1_7_,cluster_data.lock);
    if (cluster_data.lock != '\0') {
      do {
        cluster_data.lock = '\x01';
        local_88.tv_sec = 0;
        local_88.tv_nsec = 1;
        nanosleep(&local_88,(timespec *)0x0);
        LOCK();
        UNLOCK();
        local_88.tv_sec = CONCAT71(local_88.tv_sec._1_7_,cluster_data.lock);
      } while (cluster_data.lock != '\0');
    }
    cluster_data.lock = '\x01';
    for (__ptr = cluster_data.clients.next; __ptr != &cluster_data.clients; __ptr = __ptr->next) {
      if (__ptr->obj == (void *)uuid) {
        if ((__ptr != (fio_ls_s *)0x0) && (pfVar3 = __ptr->next, pfVar3 != __ptr)) {
          pfVar4 = __ptr->prev;
          pfVar3->prev = pfVar4;
          pfVar4->next = pfVar3;
          free(__ptr);
        }
        break;
      }
    }
    fVar5 = cluster_data.lock;
    LOCK();
    cluster_data.lock = '\0';
    UNLOCK();
    local_88.tv_sec = CONCAT71(local_88.tv_sec._1_7_,fVar5);
  }
  else if (((fio_data->active != '\0') && ((int)pr_[3].rsv != 8)) && (fio_data->active != '\0')) {
    if (0 < FIO_LOG_LEVEL) {
      uVar6 = getpid();
      FIO_LOG2STDERR("FATAL: (%d) Parent Process crash detected!",(ulong)uVar6);
    }
    fio_state_callback_force(FIO_CALL_ON_PARENT_CRUSH);
    fio_state_callback_clear(FIO_CALL_ON_PARENT_CRUSH);
    fio_cluster_data_cleanup(1);
    __pid = getpid();
    kill(__pid,2);
  }
  p_Var9 = pr_[1].on_data;
  if (p_Var9 != (_func_void_intptr_t_fio_protocol_s_ptr *)0x0) {
    LOCK();
    pcVar1 = p_Var9 + 0x30;
    *(long *)pcVar1 = *(long *)pcVar1 + -1;
    UNLOCK();
    if (*(long *)pcVar1 == 0) {
      if (*(long *)(p_Var9 + 0x40) != 0) {
        lVar8 = *(long *)(p_Var9 + 0x40);
        do {
          lVar7 = lVar8 + -1;
          *(long *)(p_Var9 + 0x40) = lVar7;
          if (*(code **)(p_Var9 + (lVar8 * 3 + 7) * 8) != (code *)0x0) {
            local_88.tv_sec = local_88.tv_sec & 0xffffffff00000000;
            uStack_70 = (undefined3)*(undefined8 *)(p_Var9 + 0x10);
            uStack_6d = (undefined5)((ulong)*(undefined8 *)(p_Var9 + 0x10) >> 0x18);
            local_88.tv_nsec = *(long *)p_Var9;
            uStack_78 = *(undefined8 *)(p_Var9 + 8);
            local_58 = *(undefined8 *)(p_Var9 + 0x28);
            uStack_68 = (undefined3)*(undefined8 *)(p_Var9 + 0x18);
            uStack_65 = (undefined5)((ulong)*(undefined8 *)(p_Var9 + 0x18) >> 0x18);
            uStack_60 = (undefined3)*(undefined8 *)(p_Var9 + 0x20);
            uStack_5d = (undefined5)((ulong)*(undefined8 *)(p_Var9 + 0x20) >> 0x18);
            local_50 = 0;
            uStack_48 = 0;
            local_40 = 0;
            (**(code **)(p_Var9 + (lVar8 * 3 + 7) * 8))
                      (&local_88,*(undefined8 *)(p_Var9 + (lVar7 * 3 + 0xb) * 8));
            lVar7 = *(long *)(p_Var9 + 0x40);
          }
          lVar8 = lVar7;
        } while (lVar7 != 0);
      }
      fio_free(p_Var9);
    }
  }
  pr_[1].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  p_Var9 = pr_[2].on_data;
  if (0 < (long)pr_[1].rsv && p_Var9 != (_func_void_intptr_t_fio_protocol_s_ptr *)0x0) {
    p_Var10 = p_Var9 + pr_[1].rsv * 0x40;
    do {
      if (*(long *)p_Var9 != 0) {
        LOCK();
        pcVar1 = p_Var9 + 8;
        iVar2 = *(int *)pcVar1;
        *(int *)pcVar1 = *(int *)pcVar1 + -1;
        UNLOCK();
        if (iVar2 == 0) {
          if ((p_Var9[0xc] == (_func_void_intptr_t_fio_protocol_s_ptr)0x0) &&
             (*(code **)(p_Var9 + 0x28) != (code *)0x0)) {
            (**(code **)(p_Var9 + 0x28))(*(long *)(p_Var9 + 0x30));
          }
          local_88.tv_sec = 0;
          local_88.tv_nsec = 0;
          uStack_78 = 0;
          uStack_70 = 0;
          uStack_6d = 0;
          uStack_68 = 0;
          uStack_65 = 0;
          uStack_60 = 0;
          *(undefined4 *)(p_Var9 + 8) = 0;
          p_Var9[0xc] = (code)0x1;
          memcpy(p_Var9 + 0xd,&local_88,0x2b);
        }
        fio_unsubscribe(*(subscription_s **)(p_Var9 + 0x38));
      }
      p_Var9 = p_Var9 + 0x40;
    } while (p_Var9 < p_Var10);
  }
  fio_free(pr_[2].on_ready);
  fio_free(pr_[2].on_data);
  pr_[2].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  pr_[2].on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0;
  pr_[1].rsv = 0;
  pr_[2].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  pr_[1].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  pr_[1].ping = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  fio_free(pr_);
  return;
}

Assistant:

static void fio_cluster_on_close(intptr_t uuid, fio_protocol_s *pr_) {
  cluster_pr_s *c = (cluster_pr_s *)pr_;
  if (!fio_data->is_worker) {
    /* a child was lost, respawning is handled elsewhere. */
    fio_lock(&cluster_data.lock);
    FIO_LS_FOR(&cluster_data.clients, pos) {
      if (pos->obj == (void *)uuid) {
        fio_ls_remove(pos);
        break;
      }
    }
    fio_unlock(&cluster_data.lock);
  } else if (fio_data->active) {
    /* no shutdown message received - parent crashed. */
    if (c->type != FIO_CLUSTER_MSG_SHUTDOWN && fio_is_running()) {
      FIO_LOG_FATAL("(%d) Parent Process crash detected!", (int)getpid());
      fio_state_callback_force(FIO_CALL_ON_PARENT_CRUSH);
      fio_state_callback_clear(FIO_CALL_ON_PARENT_CRUSH);
      fio_cluster_data_cleanup(1);
      kill(getpid(), SIGINT);
    }
  }
  if (c->msg)
    fio_msg_internal_free(c->msg);
  c->msg = NULL;
  fio_sub_hash_free(&c->pubsub);
  fio_cluster_protocol_free(c);
  (void)uuid;
}